

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-outputs.cc
# Opt level: O2

void basic_datatype_test_integral<short,true>(string *name)

{
  int i;
  int iVar1;
  vector<short,_std::allocator<short>_> v;
  short local_5a;
  _Vector_base<short,_std::allocator<short>_> local_58;
  string local_40;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar1 = 0; iVar1 != 4; iVar1 = iVar1 + 1) {
    local_5a = (short)iVar1;
    std::vector<short,_std::allocator<short>_>::emplace_back<short>
              ((vector<short,_std::allocator<short>_> *)&local_58,&local_5a);
  }
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  runtest_maybe_dobin<std::vector<short,std::allocator<short>>,true>
            (&local_40,(vector<short,_std::allocator<short>_> *)&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void basic_datatype_test_integral(std::string name) {
    std::vector<T> v;
    for(int i=0; i<4; i++) {
        v.push_back(i);
    }
    runtest_maybe_dobin<std::vector<T>, DoBinary>(name, v);
}